

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlschemas.c
# Opt level: O3

xmlSchemaModelGroupDefPtr
xmlSchemaParseModelGroupDefinition(xmlSchemaParserCtxtPtr ctxt,xmlSchemaPtr schema,xmlNodePtr node)

{
  xmlChar *refTargetNs;
  _xmlAttr *p_Var1;
  int iVar2;
  xmlAttrPtr in_RAX;
  xmlAttrPtr pxVar3;
  xmlSchemaTypePtr attr;
  undefined4 extraout_var;
  xmlSchemaModelGroupDefPtr extraout_RAX;
  undefined8 *item;
  xmlSchemaRedefPtr_conflict pxVar4;
  undefined4 extraout_var_00;
  xmlSchemaModelGroupDefPtr pxVar5;
  xmlSchemaModelGroupDefPtr extraout_RAX_00;
  xmlSchemaModelGroupDefPtr extraout_RAX_01;
  xmlSchemaTypeType type;
  xmlNodePtr in_RCX;
  xmlAttrPtr attr_00;
  xmlSchemaBasicItemPtr extraout_RDX;
  xmlSchemaBasicItemPtr extraout_RDX_00;
  xmlSchemaBasicItemPtr extraout_RDX_01;
  xmlSchemaBasicItemPtr pxVar6;
  xmlSchemaBasicItemPtr extraout_RDX_02;
  xmlSchemaBasicItemPtr extraout_RDX_03;
  xmlSchemaBasicItemPtr extraout_RDX_04;
  xmlChar **in_R8;
  char *in_R9;
  _xmlNode *node_00;
  xmlChar *name;
  
  attr_00 = (xmlAttrPtr)&stack0xffffffffffffffc8;
  pxVar3 = xmlSchemaGetPropNode(node,"name");
  if (pxVar3 == (xmlAttrPtr)0x0) {
    xmlSchemaPMissingAttrErr
              (ctxt,(xmlParserErrors)node,(xmlSchemaBasicItemPtr)0x1c9054,in_RCX,(char *)in_R8,in_R9
              );
    return extraout_RAX;
  }
  attr = xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME);
  iVar2 = xmlSchemaPValAttrNode
                    (ctxt,(xmlSchemaBasicItemPtr)pxVar3,(xmlAttrPtr)attr,
                     (xmlSchemaTypePtr)&stack0xffffffffffffffc8,in_R8);
  if (iVar2 != 0) {
    return (xmlSchemaModelGroupDefPtr)CONCAT44(extraout_var,iVar2);
  }
  if (in_RAX == (xmlAttrPtr)0x0) {
    return (xmlSchemaModelGroupDefPtr)CONCAT44(extraout_var,iVar2);
  }
  refTargetNs = ctxt->targetNamespace;
  pxVar3 = in_RAX;
  item = (undefined8 *)(*xmlMalloc)(0x40);
  if (item == (undefined8 *)0x0) {
    xmlSchemaPErrMemory(ctxt);
    return extraout_RAX_01;
  }
  item[4] = 0;
  item[5] = 0;
  *item = 0;
  item[1] = 0;
  item[6] = 0;
  item[7] = 0;
  item[2] = 0;
  item[3] = 0;
  item[4] = in_RAX;
  *(undefined4 *)item = 0x11;
  item[6] = node;
  item[5] = refTargetNs;
  if (ctxt->isRedefine != 0) {
    pxVar4 = xmlSchemaAddRedef(ctxt,ctxt->redefined,item,(xmlChar *)in_RAX,refTargetNs);
    ctxt->redef = pxVar4;
    if (pxVar4 == (xmlSchemaRedefPtr_conflict)0x0) goto LAB_001965f8;
    ctxt->redefCounter = 0;
    attr_00 = in_RAX;
  }
  iVar2 = xmlSchemaAddItemSize(&ctxt->constructor->bucket->globals,5,item);
  if (iVar2 < 0) {
    ctxt->nberrors = ctxt->nberrors + 1;
    ctxt->err = 2;
    xmlRaiseMemoryError(ctxt->serror,ctxt->error,ctxt->errCtxt,0x10,(xmlError *)0x0);
LAB_001965f8:
    pxVar5 = (xmlSchemaModelGroupDefPtr)(*xmlFree)(item);
    return pxVar5;
  }
  iVar2 = xmlSchemaAddItemSize(&ctxt->constructor->pending,10,item);
  pxVar6 = extraout_RDX;
  if (iVar2 < 0) {
    xmlSchemaPErrMemory(ctxt);
    pxVar6 = extraout_RDX_00;
  }
  for (p_Var1 = node->properties; p_Var1 != (_xmlAttr *)0x0; p_Var1 = p_Var1->next) {
    if (p_Var1->ns == (xmlNs *)0x0) {
      iVar2 = xmlStrEqual(p_Var1->name,"name");
      pxVar6 = extraout_RDX_03;
      if ((iVar2 == 0) &&
         (iVar2 = xmlStrEqual(p_Var1->name,"id"), pxVar6 = extraout_RDX_04, iVar2 == 0))
      goto LAB_00196428;
    }
    else {
      iVar2 = xmlStrEqual(p_Var1->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      pxVar6 = extraout_RDX_01;
      if (iVar2 != 0) {
LAB_00196428:
        xmlSchemaPIllegalAttrErr(ctxt,(xmlParserErrors)p_Var1,pxVar6,attr_00);
        pxVar6 = extraout_RDX_02;
      }
    }
  }
  iVar2 = xmlSchemaPValAttrID(ctxt,node,(xmlChar *)pxVar6);
  node_00 = node->children;
  if (node_00 == (xmlNodePtr)0x0) {
    return (xmlSchemaModelGroupDefPtr)CONCAT44(extraout_var_00,iVar2);
  }
  if (((node_00->ns != (xmlNs *)0x0) &&
      (iVar2 = xmlStrEqual(node_00->name,(xmlChar *)"annotation"), iVar2 != 0)) &&
     (iVar2 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema"),
     iVar2 != 0)) {
    pxVar5 = (xmlSchemaModelGroupDefPtr)xmlSchemaParseAnnotation(ctxt,node_00,1);
    item[1] = pxVar5;
    node_00 = node_00->next;
    if (node_00 == (_xmlNode *)0x0) {
      return pxVar5;
    }
  }
  if (node_00->ns == (xmlNs *)0x0) goto LAB_001965a6;
  iVar2 = xmlStrEqual(node_00->name,"all");
  if (iVar2 == 0) {
LAB_0019650f:
    if (node_00->ns == (xmlNs *)0x0) goto LAB_001965a6;
    iVar2 = xmlStrEqual(node_00->name,(xmlChar *)"choice");
    if (iVar2 != 0) {
      iVar2 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
      type = XML_SCHEMA_TYPE_CHOICE;
      if (iVar2 != 0) goto LAB_00196583;
    }
    if ((node_00->ns == (xmlNs *)0x0) ||
       (iVar2 = xmlStrEqual(node_00->name,(xmlChar *)"sequence"), iVar2 == 0)) goto LAB_001965a6;
    iVar2 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
    type = XML_SCHEMA_TYPE_SEQUENCE;
    if (iVar2 == 0) goto LAB_001965a6;
  }
  else {
    iVar2 = xmlStrEqual(node_00->ns->href,(xmlChar *)"http://www.w3.org/2001/XMLSchema");
    type = XML_SCHEMA_TYPE_ALL;
    if (iVar2 == 0) goto LAB_0019650f;
  }
LAB_00196583:
  pxVar5 = (xmlSchemaModelGroupDefPtr)xmlSchemaParseModelGroup(ctxt,schema,node_00,type,0);
  item[3] = pxVar5;
  node_00 = node_00->next;
  if (node_00 == (_xmlNode *)0x0) {
    return pxVar5;
  }
LAB_001965a6:
  xmlSchemaPContentErr
            (ctxt,XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,(xmlSchemaBasicItemPtr)node,node_00,
             (xmlNodePtr)0x0,"(annotation?, (all | choice | sequence)?)",(char *)pxVar3);
  return extraout_RAX_00;
}

Assistant:

static xmlSchemaModelGroupDefPtr
xmlSchemaParseModelGroupDefinition(xmlSchemaParserCtxtPtr ctxt,
				   xmlSchemaPtr schema,
				   xmlNodePtr node)
{
    xmlSchemaModelGroupDefPtr item;
    xmlNodePtr child = NULL;
    xmlAttrPtr attr;
    const xmlChar *name;

    if ((ctxt == NULL) || (schema == NULL) || (node == NULL))
        return (NULL);

    attr = xmlSchemaGetPropNode(node, "name");
    if (attr == NULL) {
	xmlSchemaPMissingAttrErr(ctxt,
	    XML_SCHEMAP_S4S_ATTR_MISSING,
	    NULL, node,
	    "name", NULL);
	return (NULL);
    } else if (xmlSchemaPValAttrNode(ctxt, NULL, attr,
	xmlSchemaGetBuiltInType(XML_SCHEMAS_NCNAME), &name) != 0) {
	return (NULL);
    }
    item = xmlSchemaAddModelGroupDefinition(ctxt, schema, name,
	ctxt->targetNamespace, node);
    if (item == NULL)
	return (NULL);
    /*
    * Check for illegal attributes.
    */
    attr = node->properties;
    while (attr != NULL) {
	if (attr->ns == NULL) {
	    if ((!xmlStrEqual(attr->name, BAD_CAST "name")) &&
		(!xmlStrEqual(attr->name, BAD_CAST "id"))) {
		xmlSchemaPIllegalAttrErr(ctxt,
		    XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	    }
	} else if (xmlStrEqual(attr->ns->href, xmlSchemaNs)) {
	    xmlSchemaPIllegalAttrErr(ctxt,
		XML_SCHEMAP_S4S_ATTR_NOT_ALLOWED, NULL, attr);
	}
	attr = attr->next;
    }
    xmlSchemaPValAttrID(ctxt, node, BAD_CAST "id");
    /*
    * And now for the children...
    */
    child = node->children;
    if (IS_SCHEMA(child, "annotation")) {
	item->annot = xmlSchemaParseAnnotation(ctxt, child, 1);
	child = child->next;
    }
    if (IS_SCHEMA(child, "all")) {
	item->children = xmlSchemaParseModelGroup(ctxt, schema, child,
	    XML_SCHEMA_TYPE_ALL, 0);
	child = child->next;
    } else if (IS_SCHEMA(child, "choice")) {
	item->children = xmlSchemaParseModelGroup(ctxt, schema, child,
	    XML_SCHEMA_TYPE_CHOICE, 0);
	child = child->next;
    } else if (IS_SCHEMA(child, "sequence")) {
	item->children = xmlSchemaParseModelGroup(ctxt, schema, child,
	    XML_SCHEMA_TYPE_SEQUENCE, 0);
	child = child->next;
    }



    if (child != NULL) {
	xmlSchemaPContentErr(ctxt,
	    XML_SCHEMAP_S4S_ELEM_NOT_ALLOWED,
	    NULL, node, child, NULL,
	    "(annotation?, (all | choice | sequence)?)");
    }
    return (item);
}